

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

uint32 BailOutRecord::BailOutFromLoopBodyHelper
                 (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,
                 uint32 bailOutOffset,BailOutKind bailOutKind,Var branchValue,Var *registerSaves,
                 BailOutReturnValue *bailOutReturnValue)

{
  uint uVar1;
  ThreadContext *pTVar2;
  InterpreterStackFrame *newInstance;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  int iVar7;
  undefined4 *puVar8;
  FunctionBody *this;
  ScriptContext *scriptContext;
  undefined4 extraout_var;
  char16 *pcVar9;
  char16 *pcVar10;
  char *pcVar11;
  undefined4 extraout_var_00;
  Var *pArgumentsObject;
  void *in_stack_ffffffffffffff28;
  wchar local_c8 [4];
  char16 debugStringBuffer [42];
  
  if (bailOutRecord->parent != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x547,"(bailOutRecord->parent == nullptr)",
                       "bailOutRecord->parent == nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  unique0x00012000 = *(JavascriptFunction **)layout;
  this = Js::JavascriptFunction::GetFunctionBody(unique0x00012000);
  Js::FunctionBody::SetRecentlyBailedOutOfJittedLoopBody(this,true);
  scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pTVar2 = scriptContext->threadContext;
  pTVar2->disableImplicitFlags = DisableImplicitNoFlag;
  newInstance = pTVar2->leafInterpreterFrame;
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
  if ((bVar4) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_0145948a == '\x01')))) {
    if (DAT_0145c3a8 != DAT_0145c3b0) {
      bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind);
      if (!bVar4) goto LAB_003e6ee3;
    }
    iVar7 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    pcVar9 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_c8);
    uVar1 = *(uint *)(newInstance + 0xcc);
    pcVar10 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function: %s (%s) Loop: %d offset: #%04x Opcode: %s",
                  CONCAT44(extraout_var,iVar7),pcVar9,(ulong)uVar1,(ulong)bailOutOffset,pcVar10);
    if (bailOutKind != BailOutInvalid) {
      pcVar11 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar11);
    }
    Output::Print(L"\n");
  }
LAB_003e6ee3:
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,BailOutPhase,uVar5,LVar6);
  if ((bVar4) && ((bailOutKind != BailOnSimpleJitToFullJitLoopBody || (DAT_0145948a == '\x01')))) {
    if (DAT_0145c3a8 != DAT_0145c3b0) {
      bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind);
      if (!bVar4) goto LAB_003e6fd3;
    }
    iVar7 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    uVar1 = *(uint *)(newInstance + 0xcc);
    pcVar9 = Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode);
    Output::Print(L"BailOut: function %s, Loop: %d Opcode: %s",CONCAT44(extraout_var_00,iVar7),
                  (ulong)uVar1,pcVar9);
    if (bailOutKind != BailOutInvalid) {
      pcVar11 = GetBailOutKindName(bailOutKind);
      Output::Print(L" Kind: %S",pcVar11);
    }
    Output::Print(L"\n");
  }
LAB_003e6fd3:
  pArgumentsObject = Js::JavascriptCallStackLayout::GetArgumentsObjectLocation(layout);
  RestoreValues(bailOutRecord,bailOutKind,layout,newInstance,scriptContext,true,registerSaves,
                bailOutReturnValue,pArgumentsObject,branchValue,(void *)0x0,true,
                in_stack_ffffffffffffff28);
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,BailOutPhase,uVar5,LVar6);
  if (!bVar4) {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
    if (!bVar4) goto LAB_003e7070;
  }
  Output::Flush();
LAB_003e7070:
  UpdatePolymorphicFieldAccess(stack0xffffffffffffff90,bailOutRecord);
  return bailOutOffset;
}

Assistant:

uint32
BailOutRecord::BailOutFromLoopBodyHelper(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
    uint32 bailOutOffset, IR::BailOutKind bailOutKind, Js::Var branchValue, Js::Var *registerSaves, BailOutReturnValue * bailOutReturnValue)
{
    Assert(bailOutRecord->parent == nullptr);

    Js::JavascriptFunction * function = layout->functionObject;

    Js::FunctionBody * executeFunction = function->GetFunctionBody();
    executeFunction->SetRecentlyBailedOutOfJittedLoopBody(true);

    Js::ScriptContext * functionScriptContext = executeFunction->GetScriptContext();

    // Clear the disable implicit call bit in case we bail from that region
    functionScriptContext->GetThreadContext()->ClearDisableImplicitFlags();

    // The current interpreter frame for the loop body
    Js::InterpreterStackFrame * interpreterFrame = functionScriptContext->GetThreadContext()->GetLeafInterpreterFrame();
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    BAILOUT_KIND_TRACE(executeFunction, bailOutKind, _u("BailOut: function: %s (%s) Loop: %d offset: #%04x Opcode: %s"),
        executeFunction->GetDisplayName(), executeFunction->GetDebugNumberSet(debugStringBuffer), interpreterFrame->GetCurrentLoopNum(),
        bailOutOffset, Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    BAILOUT_TESTTRACE(executeFunction, bailOutKind, _u("BailOut: function %s, Loop: %d Opcode: %s"), executeFunction->GetDisplayName(),
        interpreterFrame->GetCurrentLoopNum(), Js::OpCodeUtil::GetOpCodeName(bailOutRecord->bailOutOpcode));

    // Restore bailout values
    bailOutRecord->RestoreValues(bailOutKind, layout, interpreterFrame, functionScriptContext, true, registerSaves, bailOutReturnValue, layout->GetArgumentsObjectLocation(), branchValue);

    BAILOUT_FLUSH(executeFunction);

    UpdatePolymorphicFieldAccess(function, bailOutRecord);

    // Return the resume byte code offset from the loop body to restart interpreter execution.
    return bailOutOffset;
}